

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,string_view generator)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  reference pSVar4;
  InvalidParameter *this_00;
  string_view message;
  allocator<char> local_79;
  string_view generator_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string_view key_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  generator_local._M_str = generator._M_str;
  generator_local._M_len = generator._M_len;
  key_local._M_str = key._M_str;
  key_local._M_len = key._M_len;
  iVar2 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&key_local);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = CLI::std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ::find(&(this->generatorLookup)._M_t,&generator_local);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header) {
      pSVar4 = CLI::std::
               _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
               ::operator[](&(this->sources).
                             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                             ._M_impl.super__Deque_impl_data._M_start,
                            (long)*(int *)&iVar2._M_node[1]._M_left);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&pSVar4->generatorName,
                 (basic_string_view<char,_std::char_traits<char>_> *)&generator_local);
    }
    else {
      iVar1 = *(int *)&iVar3._M_node[1]._M_left;
      pSVar4 = CLI::std::
               _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
               ::operator[](&(this->sources).
                             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                             ._M_impl.super__Deque_impl_data._M_start,
                            (long)*(int *)&iVar2._M_node[1]._M_left);
      pSVar4->generatorIndex = iVar1;
    }
    return;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,(basic_string_view<char,_std::char_traits<char>_> *)&key_local,
             &local_79);
  std::operator+(&local_68,&local_38," was not recognized as a valid publication");
  message._M_str = local_68._M_dataplus._M_p;
  message._M_len = local_68._M_string_length;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, std::string_view generator)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        auto findGen = generatorLookup.find(generator);
        if (findGen != generatorLookup.end()) {
            sources[fnd->second].generatorIndex = findGen->second;
            return;
        }
        sources[fnd->second].generatorName = generator;
    }